

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

ReservedRange * __thiscall
google::protobuf::EnumDescriptor::FindReservedRangeContainingNumber(EnumDescriptor *this,int number)

{
  int iVar1;
  ReservedRange *pRVar2;
  int in_ESI;
  EnumDescriptor *in_RDI;
  int i;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    iVar1 = reserved_range_count(in_RDI);
    if (iVar1 <= local_18) {
      return (ReservedRange *)0x0;
    }
    pRVar2 = reserved_range(in_RDI,local_18);
    if ((pRVar2->start <= in_ESI) &&
       (pRVar2 = reserved_range(in_RDI,local_18), in_ESI <= pRVar2->end)) break;
    local_18 = local_18 + 1;
  }
  pRVar2 = reserved_range(in_RDI,local_18);
  return pRVar2;
}

Assistant:

const EnumDescriptor::ReservedRange*
EnumDescriptor::FindReservedRangeContainingNumber(int number) const {
  // TODO(chrisn): Consider a non-linear search.
  for (int i = 0; i < reserved_range_count(); i++) {
    if (number >= reserved_range(i)->start &&
        number <= reserved_range(i)->end) {
      return reserved_range(i);
    }
  }
  return nullptr;
}